

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O0

bool __thiscall camp::UserObject::operator==(UserObject *this,UserObject *other)

{
  UserProperty *pUVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParentObject *pPVar6;
  ParentObject *other_00;
  bool local_31;
  UserObject *other_local;
  UserObject *this_local;
  
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_holder);
  if ((bVar2) &&
     (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&other->m_holder), bVar2)) {
    peVar5 = std::
             __shared_ptr_access<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_holder);
    iVar3 = (*peVar5->_vptr_AbstractObjectHolder[2])();
    peVar5 = std::
             __shared_ptr_access<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&other->m_holder);
    iVar4 = (*peVar5->_vptr_AbstractObjectHolder[2])();
    this_local._7_1_ = CONCAT44(extraout_var,iVar3) == CONCAT44(extraout_var_00,iVar4);
  }
  else {
    bVar2 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&this->m_parent);
    if ((bVar2) &&
       (bVar2 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&other->m_parent), bVar2)) {
      pPVar6 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
      pUVar1 = pPVar6->member;
      pPVar6 = boost::scoped_ptr<camp::ParentObject>::operator->(&other->m_parent);
      local_31 = false;
      if (pUVar1 == pPVar6->member) {
        pPVar6 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
        other_00 = boost::scoped_ptr<camp::ParentObject>::operator->(&other->m_parent);
        local_31 = operator==(&pPVar6->object,&other_00->object);
      }
      this_local._7_1_ = local_31;
    }
    else if ((this->m_class == (Class *)0x0) && (other->m_class == (Class *)0x0)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool UserObject::operator==(const UserObject& other) const
{
    if (m_holder && other.m_holder)
    {
        return m_holder->object() == other.m_holder->object();
    }
    else if (m_parent && other.m_parent)
    {
        return (&m_parent->member == &other.m_parent->member) && (m_parent->object == other.m_parent->object);
    }
    else if (!m_class && !other.m_class)
    {
        // Both are UserObject::nothing
        return true;
    }
    else
    {
        return false;
    }
}